

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O2

void __thiscall Am_Data_Locator::Add_Search_Directory(Am_Data_Locator *this,Am_Filename *dir)

{
  bool bVar1;
  _List_iterator<std::pair<Am_Filename,_unsigned_int>_> _Var2;
  ostream *poVar3;
  search_pred sStack_68;
  value_type local_48;
  
  bVar1 = Am_Filename::Is_Directory(dir);
  if (bVar1) {
    _Var2._M_node =
         (this->search_list).
         super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    std::__cxx11::string::string((string *)&sStack_68,(string *)dir);
    _Var2 = std::find_if<std::_List_iterator<std::pair<Am_Filename,unsigned_int>>,search_pred>
                      (_Var2,(_List_iterator<std::pair<Am_Filename,_unsigned_int>_>)this,&sStack_68)
    ;
    std::__cxx11::string::~string((string *)&sStack_68);
    if (_Var2._M_node == (_List_node_base *)this) {
      std::__cxx11::string::string((string *)&local_48,(string *)dir);
      local_48.second = 1;
      std::__cxx11::
      list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
      ::push_front(&this->search_list,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      *(int *)&_Var2._M_node[3]._M_next = *(int *)&_Var2._M_node[3]._M_next + 1;
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Am_Data_Locator: search path ");
  std::operator<<(poVar3,(string *)dir);
  poVar3 = std::operator<<(poVar3," is not a directory!");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void
Am_Data_Locator::Add_Search_Directory(const Am_Filename &dir)
{
  if (dir.Is_Directory()) {
    dir_list_t::iterator it =
        std::find_if(search_list.begin(), search_list.end(), search_pred(dir));
    if (it == search_list.end())
      // Put the directory in first place on search list (with a count of 1)
      search_list.push_front(std::pair<Am_Filename, unsigned int>(dir, 1));
    else
      // Increments the reference count of that directory
      ++((*it).second);
  } else
    std::cout << "Am_Data_Locator: search path " << dir
              << " is not a directory!" << std::endl;
  return;
}